

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall Client::handleGetUserPostsRequest(Client *this,GetUserPostsRequest *request)

{
  CommunicationStack *pCVar1;
  pointer pPVar2;
  bool bVar3;
  reference pvVar4;
  pointer pPVar5;
  Event EVar6;
  int local_23c;
  json j_array;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_228;
  GetUserPostsResponse local_218 [2];
  undefined1 local_1e8 [16];
  vector<Post,_std::allocator<Post>_> posts;
  json j_post;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_190;
  string local_180;
  Post post;
  string local_d8;
  User temp;
  
  if (this->user != (User *)0x0) {
    std::__cxx11::string::string((string *)&local_d8,(string *)request);
    bVar3 = Database::containsForbiddenChars(&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar3) {
      posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      temp.username._M_dataplus._M_p = (pointer)&temp.username.field_2;
      temp.username._M_string_length = 0;
      temp.username.field_2._M_local_buf[0] = '\0';
      temp.alias._M_dataplus._M_p = (pointer)&temp.alias.field_2;
      temp.alias._M_string_length = 0;
      temp.alias.field_2._M_local_buf[0] = '\0';
      temp.bio._M_dataplus._M_p = (pointer)&temp.bio.field_2;
      temp.bio._M_string_length = 0;
      posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      temp.bio.field_2._M_local_buf[0] = '\0';
      temp.password._M_dataplus._M_p = (pointer)&temp.password.field_2;
      temp.password._M_string_length = 0;
      temp.password.field_2._M_local_buf[0] = '\0';
      temp.id = 0;
      std::__cxx11::string::string((string *)&local_180,(string *)request);
      Database::getUserByUsername((User *)&post,&server.database,&local_180);
      User::operator=(&temp,(User *)&post);
      User::~User((User *)&post);
      std::__cxx11::string::~string((string *)&local_180);
      Database::getPostsByUserId
                ((vector<Post,_std::allocator<Post>_> *)&post,&server.database,temp.id);
      std::vector<Post,_std::allocator<Post>_>::_M_move_assign(&posts);
      std::vector<Post,_std::allocator<Post>_>::~vector
                ((vector<Post,_std::allocator<Post>_> *)&post);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&j_post,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&j_array,(nullptr_t)0x0);
      pPVar2 = posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      for (pPVar5 = posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
                    super__Vector_impl_data._M_start; pPVar5 != pPVar2; pPVar5 = pPVar5 + 1) {
        Post::Post(&post,pPVar5);
        local_23c = post.id;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<int,_int,_0>(&local_190,&local_23c);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&j_post,"id");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(pvVar4,&local_190);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_190);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1a0,&post.content);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&j_post,"content");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(pvVar4,&local_1a0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1a0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back(&j_array,&j_post);
        std::__cxx11::string::~string((string *)&post.content);
      }
      pCVar1 = this->communicationStack;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_228,&j_array);
      GetUserPostsResponse::GetUserPostsResponse((GetUserPostsResponse *)&post,true,&local_228);
      EVar6 = GetUserPostsResponse::operator_cast_to_basic_json(local_218);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_218,EVar6.m_value.object);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_218);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&post.content);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_228);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&j_array);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&j_post);
      User::~User(&temp);
      std::vector<Post,_std::allocator<Post>_>::~vector(&posts);
      return;
    }
  }
  pCVar1 = this->communicationStack;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[1],_char[1],_0>(&local_1b0,(char (*) [1])0x18c666);
  GetUserPostsResponse::GetUserPostsResponse((GetUserPostsResponse *)&temp,false,&local_1b0);
  EVar6 = GetUserPostsResponse::operator_cast_to_basic_json((GetUserPostsResponse *)local_1e8);
  (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_1e8,EVar6.m_value.object);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_1e8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&temp.username);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_1b0);
  return;
}

Assistant:

void Client::handleGetUserPostsRequest(GetUserPostsRequest request)
{
	if(user == nullptr || Database::containsForbiddenChars(request.username))
	{
		communicationStack->sendEvent(GetUserPostsResponse(false,""));
		return;
	}

	std::vector<Post> posts;
	User temp;

	try
	{
		temp = server.database.getUserByUsername(request.username);
		posts = server.database.getPostsByUserId(temp.getId());
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(GetUserPostsResponse(false, ""));
		return;
	}

	json j_post;
	json j_array;

	for(auto post: posts)
	{
		j_post["id"] = post.getId();
		j_post["content"] = post.getContent();
		j_array.push_back(j_post);
	}

	communicationStack->sendEvent(GetUserPostsResponse(true, j_array));
}